

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O2

void __thiscall ExecutorRegVm::Resume(ExecutorRegVm *this)

{
  FastVector<RegVmCmd_*,_false,_false>::shrink(&this->callStack,this->execErrorFinalReturnDepth);
  this->codeRunning = true;
  this->callContinue = true;
  this->execErrorMessage = (char *)0x0;
  *(undefined8 *)&this->execErrorObject = 0;
  *(undefined4 *)((long)&(this->execErrorObject).ptr + 4) = 0;
  return;
}

Assistant:

void ExecutorRegVm::Resume()
{
	callStack.shrink(execErrorFinalReturnDepth);

	codeRunning = true;

	callContinue = true;

	execErrorMessage = NULL;

	execErrorObject.typeID = 0;
	execErrorObject.ptr = NULL;
}